

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O1

bool tinyusdz::LoadUSDZFromMemory
               (uint8_t *addr,size_t length,string *filename,Stage *stage,string *warn,string *err,
               USDLoadOptions *options)

{
  size_type *psVar1;
  string *psVar2;
  string *__rhs;
  bool bVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  long *plVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  long *plVar9;
  pointer pUVar10;
  char *pcVar11;
  char cVar12;
  ulong uVar13;
  long lVar14;
  string ext;
  vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
  assets;
  long *local_108;
  long local_100;
  long local_f8;
  long lStack_f0;
  uint local_e8;
  uint local_e4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string *local_c0;
  ulong local_b8;
  string *local_b0;
  long *local_a8;
  long local_a0;
  undefined1 local_98;
  undefined7 uStack_97;
  long lStack_90;
  vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
  local_88;
  uint8_t *local_70;
  Stage *local_68;
  size_t local_60;
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_88.
  super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0 = warn;
  bVar3 = anon_unknown_27::ParseUSDZHeader(addr,length,&local_88,err,warn);
  if (bVar3) {
    local_b0 = err;
    local_70 = addr;
    local_68 = stage;
    local_60 = length;
    local_58 = filename;
    if (local_88.
        super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_88.
        super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      local_e8 = 0xffffffff;
      local_e4 = 0xffffffff;
    }
    else {
      local_e4 = 0xffffffff;
      local_b8 = 0;
      local_e8 = 0xffffffff;
      uVar13 = 0;
      do {
        pUVar10 = local_88.
                  super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar13;
        cVar12 = (char)pUVar10;
        lVar5 = ::std::__cxx11::string::rfind(cVar12,0x2e);
        if (lVar5 == -1) {
          local_a0 = 0;
          local_98 = 0;
          local_a8 = (long *)&local_98;
        }
        else {
          ::std::__cxx11::string::rfind(cVar12,0x2e);
          ::std::__cxx11::string::substr((ulong)&local_a8,(ulong)pUVar10);
        }
        lVar5 = local_a0;
        plVar7 = local_a8;
        if (local_a0 != 0) {
          lVar14 = 0;
          do {
            iVar4 = tolower((uint)*(byte *)((long)plVar7 + lVar14));
            *(char *)((long)plVar7 + lVar14) = (char)iVar4;
            lVar14 = lVar14 + 1;
          } while (lVar5 != lVar14);
        }
        if (local_a8 == (long *)&local_98) {
          lStack_f0 = lStack_90;
          local_108 = &local_f8;
        }
        else {
          local_108 = local_a8;
        }
        local_f8 = CONCAT71(uStack_97,local_98);
        local_100 = local_a0;
        local_a0 = 0;
        local_98 = 0;
        local_a8 = (long *)&local_98;
        iVar4 = ::std::__cxx11::string::compare((char *)&local_108);
        if (iVar4 == 0) {
          uVar6 = local_b8;
          if (-1 < (int)local_e4) {
            uVar6 = local_b8 & 0xff;
            if ((local_b8 & 1) == 0) {
              uVar6 = 1;
            }
            if ((local_c0 != (string *)0x0) && ((local_b8 & 1) == 0)) {
              ::std::operator+(&local_50,
                               "Multiple USDC files were found in USDZ. Use the first found one: ",
                               &local_88.
                                super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                                ._M_impl.super__Vector_impl_data._M_start[local_e4].filename);
              plVar7 = (long *)::std::__cxx11::string::append((char *)&local_50);
              psVar1 = (size_type *)(plVar7 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar7 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar1) {
                local_e0.field_2._M_allocated_capacity = *psVar1;
                local_e0.field_2._8_8_ = plVar7[3];
                local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
              }
              else {
                local_e0.field_2._M_allocated_capacity = *psVar1;
                local_e0._M_dataplus._M_p = (pointer)*plVar7;
              }
              local_e0._M_string_length = plVar7[1];
              *plVar7 = (long)psVar1;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              ::std::__cxx11::string::_M_append((char *)local_c0,(ulong)local_e0._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
                operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1
                               );
              }
              paVar8 = &local_50.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != paVar8) {
                operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1
                               );
                paVar8 = extraout_RAX;
              }
              uVar6 = CONCAT71((int7)((ulong)paVar8 >> 8),1);
            }
          }
          local_b8 = uVar6;
          if (local_e4 == 0xffffffff) {
            local_e4 = (uint)uVar13;
          }
        }
        else {
          iVar4 = ::std::__cxx11::string::compare((char *)&local_108);
          if (iVar4 == 0) {
            uVar6 = local_b8;
            if (-1 < (int)local_e8) {
              uVar6 = local_b8 & 0xff;
              if ((local_b8 & 1) == 0) {
                uVar6 = 1;
              }
              if ((local_c0 != (string *)0x0) && ((local_b8 & 1) == 0)) {
                ::std::operator+(&local_50,
                                 "Multiple USDA files were found in USDZ. Use the first found one: "
                                 ,&local_88.
                                   super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                                   ._M_impl.super__Vector_impl_data._M_start[local_e8].filename);
                plVar7 = (long *)::std::__cxx11::string::append((char *)&local_50);
                psVar1 = (size_type *)(plVar7 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar7 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar1) {
                  local_e0.field_2._M_allocated_capacity = *psVar1;
                  local_e0.field_2._8_8_ = plVar7[3];
                  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
                }
                else {
                  local_e0.field_2._M_allocated_capacity = *psVar1;
                  local_e0._M_dataplus._M_p = (pointer)*plVar7;
                }
                local_e0._M_string_length = plVar7[1];
                *plVar7 = (long)psVar1;
                plVar7[1] = 0;
                *(undefined1 *)(plVar7 + 2) = 0;
                ::std::__cxx11::string::_M_append((char *)local_c0,(ulong)local_e0._M_dataplus._M_p)
                ;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
                  operator_delete(local_e0._M_dataplus._M_p,
                                  local_e0.field_2._M_allocated_capacity + 1);
                }
                paVar8 = &local_50.field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_50._M_dataplus._M_p != paVar8) {
                  operator_delete(local_50._M_dataplus._M_p,
                                  local_50.field_2._M_allocated_capacity + 1);
                  paVar8 = extraout_RAX_00;
                }
                uVar6 = CONCAT71((int7)((ulong)paVar8 >> 8),1);
              }
            }
            local_b8 = uVar6;
            if (local_e8 == 0xffffffff) {
              local_e8 = (uint)uVar13;
            }
          }
        }
        if (local_108 != &local_f8) {
          operator_delete(local_108,local_f8 + 1);
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 < (ulong)(((long)local_88.
                                       super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_88.
                                       super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 4) *
                               -0x5555555555555555));
    }
    if ((local_e4 & local_e8) == 0xffffffff) {
      if (local_b0 != (string *)0x0) {
        ::std::__cxx11::string::append((char *)local_b0);
      }
    }
    else {
      uVar13 = (ulong)local_e4;
      if (((local_c0 != (string *)0x0) && (-1 < (int)local_e4)) && (-1 < (int)local_e8)) {
        ::std::operator+(&local_e0,"Both USDA and USDC file found. Use USDC file [",
                         &local_88.
                          super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar13].filename);
        plVar7 = (long *)::std::__cxx11::string::append((char *)&local_e0);
        plVar9 = plVar7 + 2;
        if ((long *)*plVar7 == plVar9) {
          local_f8 = *plVar9;
          lStack_f0 = plVar7[3];
          local_108 = &local_f8;
        }
        else {
          local_f8 = *plVar9;
          local_108 = (long *)*plVar7;
        }
        local_100 = plVar7[1];
        *plVar7 = (long)plVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)local_c0,(ulong)local_108);
        if (local_108 != &local_f8) {
          operator_delete(local_108,local_f8 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
      }
      __rhs = local_58;
      psVar2 = local_b0;
      if ((int)local_e4 < 0) {
        if ((int)local_e8 < 0) {
LAB_0012436c:
          bVar3 = true;
          goto LAB_00124259;
        }
        uVar13 = local_88.
                 super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start[local_e8].byte_begin;
        uVar6 = local_88.
                super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                ._M_impl.super__Vector_impl_data._M_start[local_e8].byte_end;
        if (uVar6 < uVar13) {
          if (local_b0 != (string *)0x0) {
            pcVar11 = "Invalid start/end offset to USDA data: [";
            goto LAB_001241af;
          }
        }
        else if (local_60 < uVar13) {
          if (local_b0 != (string *)0x0) {
            pcVar11 = "Invalid start offset to USDA data: [";
            goto LAB_001241af;
          }
        }
        else {
          if (uVar6 <= local_60) {
            bVar3 = LoadUSDAFromMemory(local_70 + uVar13,uVar6 - uVar13,local_58,local_68,local_c0,
                                       local_b0,options);
            if (!bVar3) {
              if (psVar2 != (string *)0x0) {
                pcVar11 = "Failed to load USDA: [";
                goto LAB_001242bb;
              }
              goto LAB_00124364;
            }
            goto LAB_0012436c;
          }
          if (local_b0 != (string *)0x0) {
            pcVar11 = "Invalid end offset to USDA data: [";
            goto LAB_001241af;
          }
        }
      }
      else {
        uVar6 = local_88.
                super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar13].byte_begin;
        uVar13 = local_88.
                 super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar13].byte_end;
        if (uVar13 < uVar6) {
          if (local_b0 != (string *)0x0) {
            pcVar11 = "Invalid start/end offset to USDC data: [";
LAB_001241af:
            ::std::operator+(&local_e0,pcVar11,local_58);
            plVar7 = (long *)::std::__cxx11::string::append((char *)&local_e0);
            plVar9 = plVar7 + 2;
            if ((long *)*plVar7 == plVar9) {
              local_f8 = *plVar9;
              lStack_f0 = plVar7[3];
              local_108 = &local_f8;
            }
            else {
              local_f8 = *plVar9;
              local_108 = (long *)*plVar7;
            }
            local_100 = plVar7[1];
            *plVar7 = (long)plVar9;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            ::std::__cxx11::string::_M_append((char *)psVar2,(ulong)local_108);
            if (local_108 != &local_f8) {
              operator_delete(local_108,local_f8 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
              operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
            }
          }
        }
        else if (local_60 < uVar6) {
          if (local_b0 != (string *)0x0) {
            pcVar11 = "Invalid start offset to USDC data: [";
            goto LAB_001241af;
          }
        }
        else {
          if (uVar13 <= local_60) {
            bVar3 = LoadUSDCFromMemory(local_70 + uVar6,uVar13 - uVar6,local_58,local_68,local_c0,
                                       local_b0,options);
            if (!bVar3) {
              if (psVar2 != (string *)0x0) {
                pcVar11 = "Failed to load USDC: [";
LAB_001242bb:
                ::std::operator+(&local_e0,pcVar11,__rhs);
                plVar7 = (long *)::std::__cxx11::string::append((char *)&local_e0);
                plVar9 = plVar7 + 2;
                if ((long *)*plVar7 == plVar9) {
                  local_f8 = *plVar9;
                  lStack_f0 = plVar7[3];
                  local_108 = &local_f8;
                }
                else {
                  local_f8 = *plVar9;
                  local_108 = (long *)*plVar7;
                }
                local_100 = plVar7[1];
                *plVar7 = (long)plVar9;
                plVar7[1] = 0;
                *(undefined1 *)(plVar7 + 2) = 0;
                ::std::__cxx11::string::_M_append((char *)psVar2,(ulong)local_108);
                if (local_108 != &local_f8) {
                  operator_delete(local_108,local_f8 + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
                  operator_delete(local_e0._M_dataplus._M_p,
                                  local_e0.field_2._M_allocated_capacity + 1);
                }
              }
LAB_00124364:
              if (bVar3 == false) goto LAB_00124257;
            }
            goto LAB_0012436c;
          }
          if (local_b0 != (string *)0x0) {
            pcVar11 = "Invalid end offset to USDC data: [";
            goto LAB_001241af;
          }
        }
      }
    }
  }
LAB_00124257:
  bVar3 = false;
LAB_00124259:
  std::
  vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
  ::~vector(&local_88);
  return bVar3;
}

Assistant:

bool LoadUSDZFromMemory(const uint8_t *addr, const size_t length,
                        const std::string &filename, Stage *stage,
                        std::string *warn, std::string *err,
                        const USDLoadOptions &options) {
  std::vector<USDZAssetInfo> assets;
  if (!ParseUSDZHeader(addr, length, &assets, warn, err)) {
    return false;
  }

#ifdef TINYUSDZ_LOCAL_DEBUG_PRINT
  for (size_t i = 0; i < assets.size(); i++) {
    DCOUT("[" << i << "] " << assets[i].filename << " : byte range ("
              << assets[i].byte_begin << ", " << assets[i].byte_end << ")");
  }
#endif

  int32_t usdc_index = -1;
  int32_t usda_index = -1;
  {
    bool warned = false;  // to report single warning message.
    for (size_t i = 0; i < assets.size(); i++) {
      std::string ext = str_tolower(GetFileExtension(assets[i].filename));
      if (ext.compare("usdc") == 0) {
        if ((usdc_index > -1) && (!warned)) {
          if (warn) {
            (*warn) +=
                "Multiple USDC files were found in USDZ. Use the first found "
                "one: " +
                assets[size_t(usdc_index)].filename + "]\n";
          }
          warned = true;
        }

        if (usdc_index == -1) {
          usdc_index = int32_t(i);
        }
      } else if (ext.compare("usda") == 0) {
        if ((usda_index > -1) && (!warned)) {
          if (warn) {
            (*warn) +=
                "Multiple USDA files were found in USDZ. Use the first found "
                "one: " +
                assets[size_t(usda_index)].filename + "]\n";
          }
          warned = true;
        }
        if (usda_index == -1) {
          usda_index = int32_t(i);
        }
      }
    }
  }

  if ((usdc_index == -1) && (usda_index == -1)) {
    if (err) {
      (*err) += "Neither USDC nor USDA file found in USDZ\n";
    }
    return false;
  }

  if ((usdc_index >= 0) && (usda_index >= 0)) {
    if (warn) {
      (*warn) += "Both USDA and USDC file found. Use USDC file [" +
                 assets[size_t(usdc_index)].filename + "]\n";
    }
  }

  if (usdc_index >= 0) {
    const size_t start_addr_offset = assets[size_t(usdc_index)].byte_begin;
    const size_t end_addr_offset = assets[size_t(usdc_index)].byte_end;
    if (end_addr_offset < start_addr_offset) {
      if (err) {
        (*err) +=
            "Invalid start/end offset to USDC data: [" + filename + "].\n";
      }
      return false;
    }
    const size_t usdc_size = end_addr_offset - start_addr_offset;

    if (start_addr_offset > length) {
      if (err) {
        (*err) += "Invalid start offset to USDC data: [" + filename + "].\n";
      }
      return false;
    }

    if (end_addr_offset > length) {
      if (err) {
        (*err) += "Invalid end offset to USDC data: [" + filename + "].\n";
      }
      return false;
    }

    const uint8_t *usdc_addr = addr + start_addr_offset;
    bool ret = LoadUSDCFromMemory(usdc_addr, usdc_size, filename, stage, warn,
                                  err, options);

    if (!ret) {
      if (err) {
        (*err) += "Failed to load USDC: [" + filename + "].\n";
      }

      return false;
    }
  } else if (usda_index >= 0) {
    const size_t start_addr_offset = assets[size_t(usda_index)].byte_begin;
    const size_t end_addr_offset = assets[size_t(usda_index)].byte_end;
    if (end_addr_offset < start_addr_offset) {
      if (err) {
        (*err) +=
            "Invalid start/end offset to USDA data: [" + filename + "].\n";
      }
      return false;
    }
    const size_t usda_size = end_addr_offset - start_addr_offset;

    if (start_addr_offset > length) {
      if (err) {
        (*err) += "Invalid start offset to USDA data: [" + filename + "].\n";
      }
      return false;
    }

    if (end_addr_offset > length) {
      if (err) {
        (*err) += "Invalid end offset to USDA data: [" + filename + "].\n";
      }
      return false;
    }

    const uint8_t *usda_addr = addr + start_addr_offset;
    bool ret = LoadUSDAFromMemory(usda_addr, usda_size, filename, stage, warn,
                                  err, options);

    if (!ret) {
      if (err) {
        (*err) += "Failed to load USDA: [" + filename + "].\n";
      }

      return false;
    }
  }

#if 0 // TODO: Remove
  // Decode images
  for (size_t i = 0; i < assets.size(); i++) {
    const std::string &uri = assets[i].filename;
    const std::string ext = GetFileExtension(uri);

    if ((ext.compare("png") == 0) || (ext.compare("jpg") == 0) ||
        (ext.compare("jpeg") == 0)) {
      const size_t start_addr_offset = assets[i].byte_begin;
      const size_t end_addr_offset = assets[i].byte_end;
      const size_t asset_size = end_addr_offset - start_addr_offset;
      const uint8_t *asset_addr = addr + start_addr_offset;

      if (end_addr_offset < start_addr_offset) {
        if (err) {
          (*err) += "Invalid start/end offset of asset #" + std::to_string(i) +
                    " in USDZ data: [" + filename + "].\n";
        }
        return false;
      }

      if (start_addr_offset > length) {
        if (err) {
          (*err) += "Invalid start offset of asset #" + std::to_string(i) +
                    " in USDZ data: [" + filename + "].\n";
        }
        return false;
      }

      if (end_addr_offset > length) {
        if (err) {
          (*err) += "Invalid end offset of asset #" + std::to_string(i) +
                    " in USDZ data: [" + filename + "].\n";
        }
        return false;
      }

      if (asset_size > (options.max_allowed_asset_size_in_mb * 1024ull * 1024ull)) {
        PUSH_ERROR_AND_RETURN_TAG(kTagUSDZ, fmt::format("Asset no[{}] file size too large. {} bytes (max_allowed_asset_size {})",
          i, asset_size, options.max_allowed_asset_size_in_mb * 1024ull * 1024ull));
      }

      DCOUT("Image asset size: " << asset_size);

      {
        nonstd::expected<image::ImageInfoResult, std::string> info =
            image::GetImageInfoFromMemory(asset_addr, asset_size, uri);

        if (info) {
          if (info->width == 0) {
            PUSH_ERROR_AND_RETURN_TAG(kTagUSDZ, fmt::format("Assset no[{}] Image has zero width.", i));
          }

          if (info->width > options.max_image_width) {
            PUSH_ERROR_AND_RETURN_TAG(
                kTagUSDZ, fmt::format("Asset no[{}] Image width too large. {} (max_image_width {})", i, info->width, options.max_image_width));
          }

          if (info->height == 0) {
            PUSH_ERROR_AND_RETURN_TAG(kTagUSDZ, fmt::format("Asset no[{}] Image has zero height.", i));
          }

          if (info->height > options.max_image_height) {
            PUSH_ERROR_AND_RETURN_TAG(
                kTagUSDZ,
                fmt::format("Asset no[{}] Image height too large. {} (max_image_height {})", i, info->height, options.max_image_height));
          }

          if (info->channels == 0) {
            PUSH_ERROR_AND_RETURN_TAG(kTagUSDZ, fmt::format("Asset no[{}] Image has zero channels.", i));
          }

          if (info->channels > options.max_image_channels) {
            PUSH_ERROR_AND_RETURN_TAG(
                kTagUSDZ,
                fmt::format("Asset no[{}] Image channels too much", i));
          }
        }
      }

      Image image;
      nonstd::expected<image::ImageResult, std::string> ret =
          image::LoadImageFromMemory(asset_addr, asset_size, uri);

      if (!ret) {
        (*err) += ret.error();
      } else {
        image = (*ret).image;
        if (!(*ret).warning.empty()) {
          (*warn) += (*ret).warning;
        }
      }
    } else {
      // TODO: Support other asserts(e.g. audio mp3)
    }
  }
#endif

  return true;
}